

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::GetIDWithSeed(char *str,char *str_end,ImGuiID seed)

{
  ImU32 id_00;
  undefined8 local_30;
  ImGuiID id;
  ImGuiID seed_local;
  char *str_end_local;
  char *str_local;
  
  if (str_end == (char *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = (long)str_end - (long)str;
  }
  id_00 = ImHashStr(str,local_30,seed);
  KeepAliveID(id_00);
  return id_00;
}

Assistant:

ImGuiID ImGui::GetIDWithSeed(const char* str, const char* str_end, ImGuiID seed)
{
    ImGuiID id = ImHashStr(str, str_end ? (str_end - str) : 0, seed);
    ImGui::KeepAliveID(id);
#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiContext& g = *GImGui;
    IMGUI_TEST_ENGINE_ID_INFO2(id, ImGuiDataType_String, str, str_end);
#endif
    return id;
}